

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast6.c
# Opt level: O3

word Extra_Truth6MinimumRoundMany(word t,int *pStore,char *pCanonPerm,uint *pCanonPhase)

{
  int iVar1;
  int iVar2;
  word wVar3;
  long lVar4;
  
  do {
    wVar3 = t;
    iVar2 = *pStore;
    lVar4 = 0;
    t = wVar3;
    do {
      iVar1 = pStore[lVar4 + 1];
      if (iVar2 == pStore[lVar4 + 1]) {
        t = Extra_Truth6MinimumRoundOne(t,(int)lVar4,pCanonPerm,pCanonPhase);
        iVar1 = iVar2;
      }
      iVar2 = iVar1;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 5);
  } while (wVar3 != t);
  return wVar3;
}

Assistant:

word Extra_Truth6MinimumRoundMany( word t, int* pStore, char* pCanonPerm, unsigned* pCanonPhase )
{
    int i, bitInfoTemp;
    word tMin0, tMin=t;
    do
    {
        bitInfoTemp = pStore[0];
        tMin0 = tMin;
        for ( i = 0; i < 5; i++ )
        {
            if(bitInfoTemp == pStore[i+1])          
                tMin = Extra_Truth6MinimumRoundOne( tMin, i, pCanonPerm, pCanonPhase );         
            else
                bitInfoTemp = pStore[i+1];
        }
    }while ( tMin0 != tMin );
    return tMin;
}